

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmInstruction * __thiscall
anon_unknown.dwarf_22bf96::CreateInstruction
          (anon_unknown_dwarf_22bf96 *this,VmModule *module,SynBase *source,VmType type,
          VmInstructionType cmd,VmValue *first,VmValue *second,VmValue *third,VmValue *fourth,
          VmValue *fifth)

{
  uint uVar1;
  VmInstructionType cmd_00;
  Allocator *pAVar2;
  bool bVar3;
  VmInstruction *this_00;
  undefined4 in_register_0000008c;
  
  if (*(long *)(this + 0x30) == 0) {
    __assert_fail("module->currentBlock",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x127,
                  "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                 );
  }
  this_00 = (VmInstruction *)
            (**(code **)(**(long **)(this + 0x15b8) + 0x10))(*(long **)(this + 0x15b8),0x138);
  pAVar2 = *(Allocator **)(this + 0x15b8);
  uVar1 = *(uint *)(*(long *)(this + 0x28) + 0xcc);
  *(uint *)(*(long *)(this + 0x28) + 0xcc) = uVar1 + 1;
  (this_00->super_VmValue).typeID = 2;
  *(SynBase **)&(this_00->super_VmValue).type = source;
  (this_00->super_VmValue).type.structType = type._0_8_;
  (this_00->super_VmValue).source = (SynBase *)module;
  (this_00->super_VmValue).comment.begin = (char *)0x0;
  (this_00->super_VmValue).comment.end = (char *)0x0;
  (this_00->super_VmValue).users.allocator = pAVar2;
  (this_00->super_VmValue).users.data = (this_00->super_VmValue).users.little;
  (this_00->super_VmValue).users.count = 0;
  (this_00->super_VmValue).users.max = 8;
  (this_00->super_VmValue).hasKnownNonSimpleUse = false;
  (this_00->super_VmValue).hasSideEffects = false;
  (this_00->super_VmValue).hasMemoryAccess = false;
  (this_00->super_VmValue).canBeRemoved = true;
  (this_00->super_VmValue).hasKnownSimpleUse = false;
  (this_00->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmInstruction_003e8cc8;
  this_00->cmd = (VmInstructionType)type.structType;
  this_00->uniqueId = uVar1;
  (this_00->arguments).allocator = pAVar2;
  (this_00->arguments).data = (this_00->arguments).little;
  (this_00->arguments).count = 0;
  (this_00->arguments).max = 4;
  (this_00->regVmRegisters).allocator = pAVar2;
  (this_00->regVmRegisters).data = (this_00->regVmRegisters).little;
  (this_00->regVmRegisters).max = 8;
  (this_00->regVmRegisters).count = 0;
  this_00->parent = (VmBlock *)0x0;
  this_00->prevSibling = (VmInstruction *)0x0;
  *(undefined8 *)((long)&this_00->prevSibling + 1) = 0;
  *(undefined8 *)((long)&this_00->nextSibling + 1) = 0;
  this_00->regVmCompletedUsers = 0;
  this_00->regVmSearchMarker = 0;
  this_00->color = 0;
  this_00->marker = 0;
  this_00->idom = (VmInstruction *)0x0;
  this_00->intersectingIdom = (VmInstruction *)0x0;
  if ((VmValue *)CONCAT44(in_register_0000008c,cmd) == (VmValue *)0x0) {
    if (first != (VmValue *)0x0) {
      __assert_fail("first",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x130,
                    "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                   );
    }
LAB_00284da1:
    if (second != (VmValue *)0x0) {
      __assert_fail("second",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x136,
                    "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                   );
    }
LAB_00284dad:
    if (third != (VmValue *)0x0) {
      __assert_fail("third",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x13c,
                    "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                   );
    }
  }
  else {
    VmInstruction::AddArgument(this_00,(VmValue *)CONCAT44(in_register_0000008c,cmd));
    if (first == (VmValue *)0x0) goto LAB_00284da1;
    VmInstruction::AddArgument(this_00,first);
    if (second == (VmValue *)0x0) goto LAB_00284dad;
    VmInstruction::AddArgument(this_00,second);
    if (third != (VmValue *)0x0) {
      VmInstruction::AddArgument(this_00,third);
      if (fourth != (VmValue *)0x0) {
        VmInstruction::AddArgument(this_00,fourth);
      }
      goto LAB_00284dc1;
    }
  }
  if (fourth != (VmValue *)0x0) {
    __assert_fail("fourth",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x142,
                  "VmInstruction *(anonymous namespace)::CreateInstruction(VmModule *, SynBase *, VmType, VmInstructionType, VmValue *, VmValue *, VmValue *, VmValue *, VmValue *)"
                 );
  }
LAB_00284dc1:
  cmd_00 = this_00->cmd;
  bVar3 = HasSideEffects(cmd_00);
  (this_00->super_VmValue).hasSideEffects = bVar3;
  bVar3 = HasMemoryAccess(cmd_00);
  (this_00->super_VmValue).hasMemoryAccess = bVar3;
  VmBlock::AddInstruction(*(VmBlock **)(this + 0x30),this_00);
  return this_00;
}

Assistant:

VmInstruction* CreateInstruction(VmModule *module, SynBase *source, VmType type, VmInstructionType cmd, VmValue *first, VmValue *second, VmValue *third, VmValue *fourth, VmValue *fifth)
	{
		assert(module->currentBlock);

		VmInstruction *inst = new (module->get<VmInstruction>()) VmInstruction(module->allocator, type, source, cmd, module->currentFunction->nextInstructionId++);

		if(first)
			inst->AddArgument(first);

		if(second)
		{
			assert(first);
			inst->AddArgument(second);
		}

		if(third)
		{
			assert(second);
			inst->AddArgument(third);
		}

		if(fourth)
		{
			assert(third);
			inst->AddArgument(fourth);
		}

		if(fifth)
		{
			assert(fourth);
			inst->AddArgument(fifth);
		}

		inst->hasSideEffects = HasSideEffects(inst->cmd);
		inst->hasMemoryAccess = HasMemoryAccess(inst->cmd);

		module->currentBlock->AddInstruction(inst);

		return inst;
	}